

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O0

char * palloc_string(char *str)

{
  string_view fmt;
  string_view fmt_00;
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  int slen;
  char *tstr;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  sVar2 = strlen(in_RDI);
  iVar1 = (int)sVar2 + 1;
  if (in_RDI == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    fmt._M_str = in_RDI;
    fmt._M_len = in_stack_ffffffffffffffe8;
    CLogger::Warn<>((CLogger *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),fmt);
    local_8 = (char *)0x0;
  }
  else {
    nAllocString = nAllocString + 1;
    local_8 = (char *)operator_new__((long)iVar1);
    if (local_8 == (char *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      fmt_00._M_str = in_RDI;
      fmt_00._M_len = (size_t)local_8;
      CLogger::Warn<>((CLogger *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),fmt_00);
      local_8 = (char *)0x0;
    }
    else {
      strcpy(local_8,in_RDI);
    }
  }
  return local_8;
}

Assistant:

char *palloc_string(const char *str)
{
	char *tstr;
	int slen = strlen(str) + 1;
	if(str == nullptr)
	{
		RS.Logger.Warn("Bad code form that'll lead to free_pstr() crashes: attempting to palloc_string a nullptr.");
		return nullptr;
	}
	nAllocString++;
//	sAllocString += slen;
	tstr = new char[slen];
	if(!tstr)
	{
		RS.Logger.Warn("Unable to allocate pstring.");
		return nullptr;
	}
	strcpy(tstr,str);
	return tstr;
}